

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_bbdpre.c
# Opt level: O1

int CVBBDPrecGetWorkSpace(void *cvode_mem,long *lenrwBBDP,long *leniwBBDP)

{
  long lVar1;
  int line;
  int iVar2;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    iVar2 = -1;
    cvode_mem = (CVodeMem)0x0;
    error_code = -1;
    line = 0x175;
  }
  else if (*(long *)((long)cvode_mem + 0x7e0) == 0) {
    msgfmt = "Linear solver memory is NULL. One of the SPILS linear solvers must be attached.";
    iVar2 = -2;
    error_code = -2;
    line = 0x17d;
  }
  else {
    lVar1 = *(long *)(*(long *)((long)cvode_mem + 0x7e0) + 0xf0);
    if (lVar1 != 0) {
      *lenrwBBDP = *(long *)(lVar1 + 0x80);
      *leniwBBDP = *(long *)(lVar1 + 0x88);
      return 0;
    }
    msgfmt = "BBD peconditioner memory is NULL. CVBBDPrecInit must be called.";
    iVar2 = -5;
    error_code = -5;
    line = 0x185;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVBBDPrecGetWorkSpace",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_bbdpre.c"
                 ,msgfmt);
  return iVar2;
}

Assistant:

int CVBBDPrecGetWorkSpace(void* cvode_mem, long int* lenrwBBDP,
                          long int* leniwBBDP)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  CVBBDPrecData pdata;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVLS_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_NULL);
    return (CVLS_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_lmem == NULL)
  {
    cvProcessError(cv_mem, CVLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBBD_LMEM_NULL);
    return (CVLS_LMEM_NULL);
  }
  cvls_mem = (CVLsMem)cv_mem->cv_lmem;

  if (cvls_mem->P_data == NULL)
  {
    cvProcessError(cv_mem, CVLS_PMEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBBD_PMEM_NULL);
    return (CVLS_PMEM_NULL);
  }
  pdata = (CVBBDPrecData)cvls_mem->P_data;

  *lenrwBBDP = pdata->rpwsize;
  *leniwBBDP = pdata->ipwsize;

  return (CVLS_SUCCESS);
}